

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack)

{
  bool bVar1;
  pointer pHVar2;
  reference pHVar3;
  reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_RSI;
  HighsDomain *in_RDI;
  HighsDomain *in_stack_00000028;
  Reason in_stack_00000030;
  HighsInt k;
  HighsDomainChange in_stack_00000038;
  HighsInt stacksize;
  HighsDomainChange *domchg;
  iterator __end2;
  iterator __begin2;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *__range2;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  *in_stack_ffffffffffffff90;
  double dVar8;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_ffffffffffffffa0;
  int local_38;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_20;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_18;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_10;
  
  in_RDI->infeasible_ = false;
  local_10 = in_RSI;
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5c6f12);
  HighsDebugSol::resetDomain((HighsDebugSol *)&pHVar2->field_0x68b0,in_RDI);
  bVar1 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::empty
                    (in_stack_ffffffffffffffa0);
  if (!bVar1) {
    local_18 = &in_RDI->domchgstack_;
    local_20._M_current =
         (HighsDomainChange *)
         std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::begin
                   (in_stack_ffffffffffffff88);
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end
              (in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff90,
                              (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      pHVar3 = __gnu_cxx::
               __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
               ::operator*(&local_20);
      if (pHVar3->boundtype == kLower) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->colLowerPos_,(long)pHVar3->column);
        *pvVar4 = -1;
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->colUpperPos_,(long)pHVar3->column);
        *pvVar4 = -1;
      }
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator++(&local_20);
    }
  }
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::clear
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x5c6ff7);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::clear
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)0x5c7005);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::clear
            ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)0x5c7013);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x5c7024);
  sVar5 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(local_10);
  local_38 = 0;
  do {
    if (local_38 == (int)sVar5) {
      return;
    }
    pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (local_10,(long)local_38);
    if (pvVar6->boundtype == kLower) {
      pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_38);
      dVar8 = pvVar6->boundval;
      pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_38);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_lower_,(long)pvVar6->column);
      if (*pvVar7 < dVar8) goto LAB_005c70bb;
    }
    else {
LAB_005c70bb:
      pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_38);
      if (pvVar6->boundtype == kUpper) {
        pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_38);
        dVar8 = pvVar6->boundval;
        this_00 = &in_RDI->col_upper_;
        pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_38);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)pvVar6->column);
        if (*pvVar7 <= dVar8) goto LAB_005c717b;
      }
      std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                (local_10,(long)local_38);
      Reason::unspecified();
      changeBound(in_stack_00000028,in_stack_00000038,in_stack_00000030);
      if ((in_RDI->infeasible_ & 1U) != 0) {
        return;
      }
    }
LAB_005c717b:
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  for (HighsInt k = 0; k != stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    changeBound(domchgstack[k], Reason::unspecified());

    if (infeasible_) break;
  }
}